

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserSharedInputState.hpp
# Opt level: O1

void __thiscall antlr::ParserInputState::~ParserInputState(ParserInputState *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_ParserInputState = (_func_int **)&PTR__ParserInputState_002fc418;
  if ((this->inputResponsible == true) && (this->input != (TokenBuffer *)0x0)) {
    (*this->input->_vptr_TokenBuffer[1])();
  }
  pcVar1 = (this->filename)._M_dataplus._M_p;
  paVar2 = &(this->filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~ParserInputState()
	{
		if (inputResponsible)
			delete input;
	}